

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

Vector<float,_2> __thiscall
deqp::gles31::Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
          (_anonymous_namespace_ *this,Vector<float,_2> (*values) [4],float xFactor,float yFactor)

{
  Vector<float,_2> VVar1;
  Vector<float,_2> local_70;
  Vector<float,_2> local_68;
  Vector<float,_2> local_60;
  Vector<float,_2> local_58;
  Vector<float,_2> local_50;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  Vector<float,_2> local_28;
  float local_20;
  float local_1c;
  float yFactor_local;
  float xFactor_local;
  Vector<float,_2> (*values_local) [4];
  
  local_20 = yFactor;
  local_1c = xFactor;
  _yFactor_local = *values;
  values_local = (Vector<float,_2> (*) [4])this;
  if (1.0 <= xFactor + yFactor) {
    tcu::operator-((tcu *)&local_60,*values + 1,*values + 3);
    tcu::operator*((tcu *)&local_58,&local_60,1.0 - local_1c);
    tcu::operator+((tcu *)&local_50,*values + 3,&local_58);
    tcu::operator-((tcu *)&local_70,*(Vector<float,_2> (*) [4])_yFactor_local + 2,
                   *(Vector<float,_2> (*) [4])_yFactor_local + 3);
    tcu::operator*((tcu *)&local_68,&local_70,1.0 - local_20);
    VVar1 = tcu::operator+((tcu *)this,&local_50,&local_68);
  }
  else {
    tcu::operator-((tcu *)&local_38,*values + 2,*values);
    tcu::operator*((tcu *)&local_30,&local_38,local_1c);
    tcu::operator+((tcu *)&local_28,*values,&local_30);
    tcu::operator-((tcu *)&local_48,_yFactor_local + 1,_yFactor_local);
    tcu::operator*((tcu *)&local_40,&local_48,local_20);
    VVar1 = tcu::operator+((tcu *)this,&local_28,&local_40);
  }
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

static inline T triQuadInterpolate (const T (&values)[4], float xFactor, float yFactor)
{
	if (xFactor + yFactor < 1.0f)
		return values[0] + (values[2]-values[0])*xFactor		+ (values[1]-values[0])*yFactor;
	else
		return values[3] + (values[1]-values[3])*(1.0f-xFactor)	+ (values[2]-values[3])*(1.0f-yFactor);
}